

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

void jsonrpccxx::check_param_type<unsigned_int>
               (size_t index,json *x,value_t expectedType,type *param_4)

{
  value_t vVar1;
  undefined8 in_RAX;
  ulong uVar2;
  longlong lVar3;
  JsonRpcException *pJVar4;
  unsigned_long_long uVar5;
  value_t t;
  value_t t_00;
  byte bVar6;
  value_t t_01;
  value_t t_02;
  value_t t_03;
  value_t t_04;
  undefined7 in_register_00000011;
  ulong uVar7;
  byte bVar9;
  double dVar10;
  size_t index_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_68;
  string local_58;
  string local_38;
  ulong uVar8;
  
  uVar7 = CONCAT71(in_register_00000011,expectedType);
  vVar1 = x->m_type;
  uVar2 = CONCAT71((int7)((ulong)in_RAX >> 8),vVar1);
  bVar9 = (byte)(uVar7 & 0xffffffff);
  index_local = index;
  if ((int)uVar7 == 6) {
    uVar8 = uVar7;
    if (vVar1 == number_integer) {
      lVar3 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<long_long,_0>(x);
      if (-1 < lVar3) {
        return;
      }
      pJVar4 = (JsonRpcException *)__cxa_allocate_exception(0x60);
      type_name_abi_cxx11_(&local_38,(jsonrpccxx *)0x6,t);
      std::operator+(&local_88,"invalid parameter: must be ",&local_38);
      std::operator+(&local_c8,&local_88,", but is ");
      type_name_abi_cxx11_(&local_58,(jsonrpccxx *)(ulong)x->m_type,t_00);
      std::operator+(&local_a8,&local_c8,&local_58);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_68,&index_local);
      JsonRpcException::JsonRpcException(pJVar4,-0x7f5a,&local_a8,&local_68);
      __cxa_throw(pJVar4,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
    }
  }
  else {
    param_4 = (type *)(uVar2 & 0xffffffff ^ 6);
    bVar6 = bVar9 ^ 5 | (byte)param_4;
    uVar8 = CONCAT71((int7)((uVar7 & 0xffffffff) >> 8),bVar6);
    if (bVar6 == 0) {
      uVar5 = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              ::get_impl<unsigned_long_long,_0>(x);
      if (uVar5 >> 0x20 == 0) {
        return;
      }
      pJVar4 = (JsonRpcException *)__cxa_allocate_exception(0x60);
      type_name_abi_cxx11_(&local_c8,(jsonrpccxx *)0x5,t_01);
      std::operator+(&local_a8,"invalid parameter: exceeds value range of ",&local_c8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::basic_json<unsigned_long_&,_unsigned_long,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)&local_88,&index_local);
      JsonRpcException::JsonRpcException(pJVar4,-0x7f5a,&local_a8,(json *)&local_88);
      __cxa_throw(pJVar4,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
    }
    if (vVar1 == number_unsigned) {
      uVar2 = 6;
      if (bVar9 == 7) {
LAB_0013b671:
        dVar10 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::get_impl<double,_0>(x);
        lVar3 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                ::get_impl<long_long,_0>(x);
        if (lVar3 == (long)dVar10) {
          return;
        }
        pJVar4 = (JsonRpcException *)__cxa_allocate_exception(0x60);
        type_name_abi_cxx11_(&local_c8,(jsonrpccxx *)(ulong)expectedType,t_04);
        std::operator+(&local_a8,"invalid parameter: exceeds value range of ",&local_c8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
        ::basic_json<unsigned_long_&,_unsigned_long,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&local_88,&index_local);
        JsonRpcException::JsonRpcException(pJVar4,-0x7f5a,&local_a8,(json *)&local_88);
        __cxa_throw(pJVar4,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
      }
    }
    else {
      param_4 = (type *)(uVar2 & 0xffffffff ^ 5);
      bVar6 = (byte)(uVar7 & 0xffffffff) ^ 7 | (byte)param_4;
      uVar8 = CONCAT71((int7)((uVar7 & 0xffffffff) >> 8),bVar6);
      if (bVar6 == 0) goto LAB_0013b671;
    }
  }
  if ((byte)uVar2 == bVar9) {
    return;
  }
  pJVar4 = (JsonRpcException *)__cxa_allocate_exception(0x60,x,uVar8,param_4);
  type_name_abi_cxx11_(&local_38,(jsonrpccxx *)(ulong)expectedType,t_02);
  std::operator+(&local_88,"invalid parameter: must be ",&local_38);
  std::operator+(&local_c8,&local_88,", but is ");
  type_name_abi_cxx11_(&local_58,(jsonrpccxx *)(ulong)x->m_type,t_03);
  std::operator+(&local_a8,&local_c8,&local_58);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json<unsigned_long_&,_unsigned_long,_0>(&local_68,&index_local);
  JsonRpcException::JsonRpcException(pJVar4,-0x7f5a,&local_a8,&local_68);
  __cxa_throw(pJVar4,&JsonRpcException::typeinfo,JsonRpcException::~JsonRpcException);
}

Assistant:

inline void check_param_type(size_t index, const json &x, json::value_t expectedType, typename std::enable_if<std::is_arithmetic<T>::value>::type * = 0) {
    if (expectedType == json::value_t::number_unsigned && x.type() == json::value_t::number_integer) {
      if (x.get<long long int>() < 0)
        throw JsonRpcException(invalid_params, "invalid parameter: must be " + type_name(expectedType) + ", but is " + type_name(x.type()), index);
    } else if (x.type() == json::value_t::number_unsigned && expectedType == json::value_t::number_integer) {
      if (x.get<long long unsigned>() > (long long unsigned)std::numeric_limits<T>::max()) {
        throw JsonRpcException(invalid_params, "invalid parameter: exceeds value range of " + type_name(expectedType), index);
      }
    }
    else if ((x.type() == json::value_t::number_unsigned || x.type() == json::value_t::number_integer) && expectedType == json::value_t::number_float) {
      if (static_cast<long long int>(x.get<double>()) != x.get<long long int>()) {
        throw JsonRpcException(invalid_params, "invalid parameter: exceeds value range of " + type_name(expectedType), index);
      }
    } else if (x.type() != expectedType) {
      throw JsonRpcException(invalid_params, "invalid parameter: must be " + type_name(expectedType) + ", but is " + type_name(x.type()), index);
    }
  }